

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaLoader::CreateAnimation
          (ColladaLoader *this,aiScene *pScene,ColladaParser *pParser,Animation *pSrcAnim,
          string *pName)

{
  pointer *pppaVar1;
  undefined8 *puVar2;
  string *this_00;
  aiMesh *paVar3;
  char *__n;
  long lVar4;
  iterator __position;
  bool bVar5;
  undefined1 auVar6 [16];
  double dVar7;
  float fVar8;
  Accessor **ppAVar9;
  aiMeshMorphAnim **__src;
  iterator iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  iterator iVar13;
  size_type sVar14;
  int iVar15;
  pointer ppVar16;
  size_t sVar17;
  Node *pNVar18;
  long lVar19;
  Logger *pLVar20;
  pointer pTVar21;
  Accessor *pAVar22;
  Data *pDVar23;
  aiNodeAnim *paVar24;
  aiVectorKey *paVar25;
  aiQuatKey *paVar26;
  aiMeshMorphAnim *paVar27;
  pointer pCVar28;
  ulong *puVar29;
  uint *puVar30;
  double *pdVar31;
  aiAnimation *paVar32;
  aiNodeAnim **__dest;
  aiMeshMorphAnim **__dest_00;
  runtime_error *this_01;
  uint uVar33;
  aiQuatKey *paVar34;
  ulong uVar35;
  _Base_ptr p_Var36;
  uint uVar37;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar38;
  char cVar39;
  uint uVar40;
  ColladaLoader *pCVar41;
  undefined1 auVar42 [8];
  size_t pos;
  ulong uVar43;
  string *psVar44;
  ulong uVar45;
  size_t sVar46;
  long lVar47;
  float fVar48;
  ai_real aVar49;
  ai_real aVar50;
  float fVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  aiMeshMorphAnim *morphAnim;
  vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_> transforms;
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> entries;
  vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> morphAnims;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> resultTrafos;
  string subElement;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims;
  string targetID;
  string nodeName;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> nodes;
  aiMatrix4x4 mat;
  aiMeshMorphAnim *local_380;
  undefined1 local_378 [8];
  pointer pTStack_370;
  pointer local_368 [2];
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> local_358;
  float local_33c;
  aiMeshMorphAnim **local_338;
  iterator iStack_330;
  _Alloc_hider local_328;
  undefined1 local_318 [16];
  aiMatrix4x4t<float> *local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Base_ptr local_2d0;
  _Alloc_hider _Stack_2c8;
  Accessor *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b8;
  Data *pDStack_2a8;
  _Base_ptr local_298;
  undefined1 local_290 [24];
  _Base_ptr local_278;
  iterator iStack_270;
  _Base_ptr local_268;
  Animation *local_260;
  ai_real local_254;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  char local_240;
  char acStack_23f [15];
  string local_230;
  ColladaParser *local_210;
  DataLibrary *local_208;
  AccessorLibrary *local_200;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> local_1f8;
  string *local_1e0;
  ColladaLoader *local_1d8;
  pointer local_1d0;
  undefined1 local_1c8 [8];
  aiAnimation *paStack_1c0;
  pointer local_1b8;
  _Base_ptr p_Stack_1b0;
  _Base_ptr local_1a8;
  _Base_ptr p_Stack_1a0;
  pointer local_198;
  undefined8 uStack_190;
  ios_base local_158 [272];
  ai_real local_48;
  
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_260 = pSrcAnim;
  local_1e0 = pName;
  CollectNodes(this,pScene->mRootNode,&local_1f8);
  local_278 = (_Base_ptr)0x0;
  iStack_270._M_current = (aiNodeAnim **)0x0;
  local_268 = (_Base_ptr)0x0;
  local_328._M_p = (pointer)0x0;
  local_338 = (aiMeshMorphAnim **)0x0;
  iStack_330._M_current = (aiMeshMorphAnim **)0x0;
  if (local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_200 = &pParser->mAccessorLibrary;
    local_208 = &pParser->mDataLibrary;
    ppVar16 = (pointer)local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    local_210 = pParser;
    local_1d8 = this;
    do {
      local_358.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar3 = (aiMesh *)ppVar16->first;
      puVar30 = &paVar3->mNumVertices;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      local_1d0 = ppVar16;
      sVar17 = strlen((char *)puVar30);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,puVar30,
                 (undefined1 *)((long)paVar3->mColors + (sVar17 - 0x2c)));
      pNVar18 = FindNode(this,pParser->mRootNode,&local_230);
      if (pNVar18 != (Node *)0x0) {
        local_250._M_allocated_capacity = (size_type)&local_240;
        local_250._8_8_ = 0;
        local_240 = '\0';
        local_298 = (_Base_ptr)(local_290 + 8);
        local_290._0_8_ = (_Base_ptr)0x0;
        local_290[8] = '\0';
        for (paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_260->mChannels).
                          super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            paVar38 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_260->mChannels).
               super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
               ._M_impl.super__Vector_impl_data._M_finish; paVar38 = paVar38 + 0xc) {
          local_318._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_318._8_8_ = &local_300;
          local_308 = (aiMatrix4x4t<float> *)0x0;
          local_300._M_local_buf[0] = '\0';
          local_2f0._M_allocated_capacity = (size_type)&local_2e0;
          local_2f0._8_8_ = (char *)0x0;
          local_2e0._M_local_buf[0] = '\0';
          aStack_2b8._8_8_ = 0;
          pDStack_2a8 = (Data *)0x0;
          local_2c0 = (Accessor *)0x0;
          aStack_2b8._M_allocated_capacity = 0;
          local_2d0 = (_Base_ptr)0x0;
          _Stack_2c8._M_p = (pointer)0x0;
          cVar39 = (char)paVar38;
          lVar19 = std::__cxx11::string::find(cVar39,0x2f);
          if (lVar19 == -1) {
            lVar19 = std::__cxx11::string::find
                               (paVar38->_M_local_buf,(ulong)(pNVar18->mID)._M_dataplus._M_p,0);
            if (lVar19 != -1) {
              local_318._0_8_ = paVar38;
              std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar38);
              this_00 = (string *)(local_318 + 8);
              std::__cxx11::string::operator=(this_00,(string *)local_1c8);
              if (local_1c8 != (undefined1  [8])&local_1b8) {
                operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
              }
              if (*(char *)local_318._8_8_ == '-') {
                std::__cxx11::string::substr((ulong)local_1c8,(ulong)this_00);
                std::__cxx11::string::operator=(this_00,(string *)local_1c8);
                if (local_1c8 != (undefined1  [8])&local_1b8) {
                  operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                }
              }
              std::
              vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ::push_back(&local_358,(value_type *)local_318);
            }
          }
          else {
            lVar19 = std::__cxx11::string::find(cVar39,0x2f);
            if (lVar19 == -1) {
              local_250._8_8_ = 0;
              *(char *)local_250._M_allocated_capacity = '\0';
              std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar38);
              std::__cxx11::string::operator=((string *)local_250._M_local_buf,(string *)local_1c8);
              if (local_1c8 != (undefined1  [8])&local_1b8) {
                operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
              }
              if ((local_250._8_8_ == (pNVar18->mID)._M_string_length) &&
                 ((local_250._8_8_ == 0 ||
                  (iVar15 = bcmp((void *)local_250._M_allocated_capacity,
                                 (pNVar18->mID)._M_dataplus._M_p,local_250._8_8_), iVar15 == 0)))) {
                lVar19 = std::__cxx11::string::find(cVar39,0x2e);
                if (lVar19 == -1) {
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar38);
                  std::__cxx11::string::operator=
                            ((string *)local_2f0._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                  }
                }
                else {
                  lVar19 = std::__cxx11::string::find(cVar39,0x2e);
                  if (lVar19 != -1) goto LAB_0042949d;
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar38);
                  std::__cxx11::string::operator=
                            ((string *)local_2f0._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                  }
                  local_290._0_8_ = (_Base_ptr)0x0;
                  *(undefined1 *)&local_298->_M_color = _S_red;
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar38);
                  std::__cxx11::string::operator=((string *)&local_298,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                  }
                  iVar15 = std::__cxx11::string::compare((char *)&local_298);
                  if (iVar15 == 0) {
                    _Stack_2c8._M_p = (pointer)0x3;
                  }
                  else {
                    iVar15 = std::__cxx11::string::compare((char *)&local_298);
                    if (iVar15 == 0) {
                      _Stack_2c8._M_p = (pointer)0x0;
                    }
                    else {
                      iVar15 = std::__cxx11::string::compare((char *)&local_298);
                      if (iVar15 == 0) {
                        _Stack_2c8._M_p = (pointer)0x1;
                      }
                      else {
                        iVar15 = std::__cxx11::string::compare((char *)&local_298);
                        if (iVar15 == 0) {
                          _Stack_2c8._M_p = (pointer)0x2;
                        }
                        else {
                          pLVar20 = DefaultLogger::get();
                          Formatter::
                          basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                          basic_formatter<char[26]>
                                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1c8,(char (*) [26])"Unknown anim subelement <");
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1c8,(char *)local_298,local_290._0_8_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1c8,">. Ignoring",0xb);
                          std::__cxx11::stringbuf::str();
                          Logger::warn(pLVar20,(char *)local_378);
                          if (local_378 != (undefined1  [8])local_368) {
                            operator_delete((void *)local_378,
                                            (ulong)((long)&(local_368[0]->mID)._M_dataplus._M_p + 1)
                                           );
                          }
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
                          std::ios_base::~ios_base(local_158);
                        }
                      }
                    }
                  }
                }
                lVar19 = std::__cxx11::string::find(cVar39,0x28);
                if (lVar19 != -1) {
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar38);
                  std::__cxx11::string::operator=
                            ((string *)local_2f0._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                  }
                  local_290._0_8_ = (_Base_ptr)0x0;
                  *(undefined1 *)&local_298->_M_color = _S_red;
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar38);
                  std::__cxx11::string::operator=((string *)&local_298,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                  }
                  iVar15 = std::__cxx11::string::compare((char *)&local_298);
                  if (iVar15 == 0) {
                    _Stack_2c8._M_p = (pointer)0x0;
                  }
                  else {
                    iVar15 = std::__cxx11::string::compare((char *)&local_298);
                    if (iVar15 == 0) {
                      _Stack_2c8._M_p = (pointer)0x1;
                    }
                    else {
                      iVar15 = std::__cxx11::string::compare((char *)&local_298);
                      if (iVar15 == 0) {
                        _Stack_2c8._M_p = (pointer)0x2;
                      }
                      else {
                        iVar15 = std::__cxx11::string::compare((char *)&local_298);
                        if (iVar15 == 0) {
                          _Stack_2c8._M_p = (pointer)0x3;
                        }
                        else {
                          iVar15 = std::__cxx11::string::compare((char *)&local_298);
                          if (iVar15 == 0) {
                            _Stack_2c8._M_p = (pointer)0x4;
                          }
                          else {
                            iVar15 = std::__cxx11::string::compare((char *)&local_298);
                            if (iVar15 == 0) {
                              _Stack_2c8._M_p = (pointer)0x5;
                            }
                            else {
                              iVar15 = std::__cxx11::string::compare((char *)&local_298);
                              if (iVar15 == 0) {
                                _Stack_2c8._M_p = (pointer)0x6;
                              }
                              else {
                                iVar15 = std::__cxx11::string::compare((char *)&local_298);
                                if (iVar15 == 0) {
                                  _Stack_2c8._M_p = (pointer)0x7;
                                }
                                else {
                                  iVar15 = std::__cxx11::string::compare((char *)&local_298);
                                  if (iVar15 == 0) {
                                    _Stack_2c8._M_p = (pointer)0x8;
                                  }
                                  else {
                                    iVar15 = std::__cxx11::string::compare((char *)&local_298);
                                    if (iVar15 == 0) {
                                      _Stack_2c8._M_p = (pointer)0x9;
                                    }
                                    else {
                                      iVar15 = std::__cxx11::string::compare((char *)&local_298);
                                      if (iVar15 == 0) {
                                        _Stack_2c8._M_p = (pointer)0xa;
                                      }
                                      else {
                                        iVar15 = std::__cxx11::string::compare((char *)&local_298);
                                        if (iVar15 == 0) {
                                          _Stack_2c8._M_p = (pointer)0xb;
                                        }
                                        else {
                                          iVar15 = std::__cxx11::string::compare((char *)&local_298)
                                          ;
                                          if (iVar15 == 0) {
                                            _Stack_2c8._M_p = (pointer)0xc;
                                          }
                                          else {
                                            iVar15 = std::__cxx11::string::compare
                                                               ((char *)&local_298);
                                            if (iVar15 == 0) {
                                              _Stack_2c8._M_p = (pointer)0xd;
                                            }
                                            else {
                                              iVar15 = std::__cxx11::string::compare
                                                                 ((char *)&local_298);
                                              if (iVar15 == 0) {
                                                _Stack_2c8._M_p = (pointer)0xe;
                                              }
                                              else {
                                                iVar15 = std::__cxx11::string::compare
                                                                   ((char *)&local_298);
                                                if (iVar15 == 0) {
                                                  _Stack_2c8._M_p = (pointer)0xf;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                uVar12 = local_2f0._8_8_;
                uVar11 = local_2f0._M_allocated_capacity;
                local_2d0 = (_Base_ptr)0xffffffffffffffff;
                pTVar21 = (pNVar18->mTransforms).
                          super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((pNVar18->mTransforms).
                    super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                    ._M_impl.super__Vector_impl_data._M_finish != pTVar21) {
                  lVar19 = 8;
                  p_Var36 = (_Base_ptr)0x0;
                  do {
                    __n = *(char **)((long)pTVar21->f + lVar19 + -0x24);
                    if ((__n == (char *)uVar12) &&
                       ((__n == (char *)0x0 ||
                        (iVar15 = bcmp(*(void **)((long)pTVar21->f + lVar19 + -0x2c),(void *)uVar11,
                                       (size_t)__n), iVar15 == 0)))) {
                      local_2d0 = p_Var36;
                    }
                    p_Var36 = (_Base_ptr)((long)&p_Var36->_M_color + 1);
                    pTVar21 = (pNVar18->mTransforms).
                              super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar19 = lVar19 + 0x68;
                  } while (p_Var36 < (_Base_ptr)
                                     (((long)(pNVar18->mTransforms).
                                             super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pTVar21 >> 3) * 0x4ec4ec4ec4ec4ec5));
                }
                if (local_2d0 == (_Base_ptr)0xffffffffffffffff) {
                  lVar19 = std::__cxx11::string::find(local_2f0._M_local_buf,0x6de58d,0);
                  if (lVar19 == -1) goto LAB_0042949d;
                  std::__cxx11::string::_M_assign((string *)(local_318 + 8));
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_2f0,0,(char *)local_2f0._8_8_,0x6d5270);
                }
                local_318._0_8_ = paVar38;
                std::
                vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ::push_back(&local_358,(value_type *)local_318);
              }
            }
          }
LAB_0042949d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_allocated_capacity != &local_2e0) {
            operator_delete((void *)local_2f0._M_allocated_capacity,
                            CONCAT71(local_2e0._M_allocated_capacity._1_7_,local_2e0._M_local_buf[0]
                                    ) + 1);
          }
          pParser = local_210;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._8_8_ != &local_300) {
            operator_delete((void *)local_318._8_8_,
                            CONCAT71(local_300._M_allocated_capacity._1_7_,local_300._M_local_buf[0]
                                    ) + 1);
          }
        }
        if (local_358.
            super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_358.
            super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          fVar8 = 1e+20;
          if (local_358.
              super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_358.
              super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            fVar8 = 1e+20;
            pCVar28 = local_358.
                      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              pAVar22 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                  (pParser,local_200,&pCVar28->mChannel->mSourceTimes);
              pCVar28->mTimeAccessor = pAVar22;
              pDVar23 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                                  (pParser,local_208,&pAVar22->mSource);
              pCVar28->mTimeData = pDVar23;
              pAVar22 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                  (pParser,local_200,&pCVar28->mChannel->mSourceValues);
              pCVar28->mValueAccessor = pAVar22;
              pDVar23 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                                  (pParser,local_208,&pAVar22->mSource);
              pCVar28->mValueData = pDVar23;
              pAVar22 = pCVar28->mTimeAccessor;
              sVar46 = pAVar22->mCount;
              if (sVar46 != pCVar28->mValueAccessor->mCount) {
LAB_0042aa22:
                this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,
                           "Time count / value count mismatch in animation channel \"",0x38);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,(pCVar28->mChannel->mTarget)._M_dataplus._M_p,
                           (pCVar28->mChannel->mTarget)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\".",2);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(this_01,(string *)local_318);
                *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
                __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              if (sVar46 != 0) {
                pDVar23 = pCVar28->mTimeData;
                pCVar41 = (ColladaLoader *)
                          (pDVar23->mValues).super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(pDVar23->mValues).
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pCVar41 >> 2) <=
                    pAVar22->mOffset) {
                  __assert_fail("pos < pData.mValues.size()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaLoader.cpp"
                                ,0x72c,
                                "ai_real Assimp::ColladaLoader::ReadFloat(const Collada::Accessor &, const Collada::Data &, size_t, size_t) const"
                               );
                }
                fVar48 = *(float *)((long)&(pCVar41->super_BaseImporter)._vptr_BaseImporter +
                                   pAVar22->mOffset * 4);
                if (fVar8 <= fVar48) {
                  fVar48 = fVar8;
                }
                ReadFloat(pCVar41,pAVar22,pDVar23,sVar46 - 1,0);
                fVar8 = fVar48;
              }
              pCVar28 = pCVar28 + 1;
            } while (pCVar28 !=
                     local_358.
                     super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          local_318._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_318._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_308 = (aiMatrix4x4t<float> *)0x0;
          if ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)->mTimeAccessor->mCount != 0)) {
            pCVar41 = (ColladaLoader *)local_378;
            std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::
            vector((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                    *)pCVar41,&pNVar18->mTransforms);
            pCVar28 = local_358.
                      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              for (; pCVar28 !=
                     local_358.
                     super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pCVar28 = pCVar28 + 1) {
                pAVar22 = pCVar28->mTimeAccessor;
                if (pAVar22->mCount == 0) {
                  fVar48 = 0.0;
                  uVar45 = 0;
                }
                else {
                  uVar45 = 0;
                  do {
                    fVar48 = ReadFloat(pCVar41,pAVar22,pCVar28->mTimeData,uVar45,0);
                    if (fVar8 <= fVar48) break;
                    uVar45 = uVar45 + 1;
                    pAVar22 = pCVar28->mTimeAccessor;
                  } while (uVar45 < pAVar22->mCount);
                }
                uVar43 = pCVar28->mTimeAccessor->mCount - 1;
                if (uVar45 <= uVar43) {
                  uVar43 = uVar45;
                }
                pAVar22 = pCVar28->mValueAccessor;
                if (pAVar22->mSize != 0) {
                  sVar46 = 0;
                  do {
                    aVar49 = ReadFloat(pCVar41,pAVar22,pCVar28->mValueData,uVar43,sVar46);
                    *(ai_real *)(local_1c8 + sVar46 * 4) = aVar49;
                    sVar46 = sVar46 + 1;
                    pAVar22 = pCVar28->mValueAccessor;
                  } while (sVar46 < pAVar22->mSize);
                }
                if ((fVar8 < fVar48) && (uVar43 != 0)) {
                  aVar49 = ReadFloat(pCVar41,pCVar28->mTimeAccessor,pCVar28->mTimeData,uVar43 - 1,0)
                  ;
                  pAVar22 = pCVar28->mValueAccessor;
                  if (pAVar22->mSize != 0) {
                    sVar46 = 0;
                    do {
                      aVar50 = ReadFloat(pCVar41,pAVar22,pCVar28->mValueData,uVar43 - 1,sVar46);
                      *(float *)(local_1c8 + sVar46 * 4) =
                           (aVar50 - *(float *)(local_1c8 + sVar46 * 4)) *
                           ((fVar8 - fVar48) / (aVar49 - fVar48)) +
                           *(float *)(local_1c8 + sVar46 * 4);
                      sVar46 = sVar46 + 1;
                      pAVar22 = pCVar28->mValueAccessor;
                    } while (sVar46 < pAVar22->mSize);
                  }
                }
                sVar46 = pCVar28->mValueAccessor->mSize;
                if (sVar46 != 0) {
                  pCVar41 = (ColladaLoader *)
                            (((aiString *)local_378)->data +
                            pCVar28->mSubElement * 4 + pCVar28->mTransformIndex * 0x68 + 0x20);
                  memcpy(pCVar41,local_1c8,sVar46 << 2);
                }
              }
              pCVar41 = (ColladaLoader *)local_1c8;
              ColladaParser::CalculateResultTransform
                        ((aiMatrix4x4 *)pCVar41,pParser,
                         (vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                          *)local_378);
              uStack_190 = (pointer)CONCAT44(fVar8,(float)uStack_190);
              if ((aiMatrix4x4t<float> *)local_318._8_8_ == local_308) {
                pCVar41 = (ColladaLoader *)local_318;
                std::vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>>::
                _M_realloc_insert<aiMatrix4x4t<float>const&>
                          ((vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>> *)
                           pCVar41,(iterator)local_318._8_8_,(aiMatrix4x4t<float> *)local_1c8);
              }
              else {
                *(pointer *)(local_318._8_8_ + 0x30) = local_198;
                *(pointer *)(local_318._8_8_ + 0x38) = uStack_190;
                *(_Base_ptr *)(local_318._8_8_ + 0x20) = local_1a8;
                *(_Base_ptr *)(local_318._8_8_ + 0x28) = p_Stack_1a0;
                *(pointer *)(local_318._8_8_ + 0x10) = local_1b8;
                *(_Base_ptr *)(local_318._8_8_ + 0x18) = p_Stack_1b0;
                *(undefined1 (*) [8])local_318._8_8_ = local_1c8;
                *(aiAnimation **)(local_318._8_8_ + 8) = paStack_1c0;
                local_318._8_8_ = local_318._8_8_ + 0x40;
              }
              fVar48 = 1e+20;
              if (local_358.
                  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_358.
                  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                fVar48 = 1e+20;
                pCVar28 = local_358.
                          super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  uVar45 = 0;
                  do {
                    aVar49 = fVar48;
                    if (pCVar28->mTimeAccessor->mCount <= uVar45) break;
                    aVar50 = ReadFloat(pCVar41,pCVar28->mTimeAccessor,pCVar28->mTimeData,uVar45,0);
                    if (fVar8 < aVar50) {
                      aVar49 = aVar50;
                      if (fVar48 <= aVar50) {
                        aVar49 = fVar48;
                      }
                    }
                    else {
                      uVar45 = uVar45 + 1;
                    }
                    fVar48 = aVar49;
                  } while (aVar50 <= fVar8);
                  fVar48 = aVar49;
                  if ((((*(int *)(((aiString *)local_378)->data +
                                 pCVar28->mTransformIndex * 0x68 + 0x1c) == 1) && (uVar45 != 0)) &&
                      (pCVar28->mSubElement == 3)) && (uVar45 < pCVar28->mTimeAccessor->mCount)) {
                    local_48 = ReadFloat(pCVar41,pCVar28->mValueAccessor,pCVar28->mValueData,uVar45,
                                         0);
                    local_254 = ReadFloat(pCVar41,pCVar28->mValueAccessor,pCVar28->mValueData,
                                          uVar45 - 1,0);
                    local_33c = ReadFloat(pCVar41,pCVar28->mTimeAccessor,pCVar28->mTimeData,uVar45,0
                                         );
                    aVar50 = ReadFloat(pCVar41,pCVar28->mTimeAccessor,pCVar28->mTimeData,uVar45 - 1,
                                       0);
                    fVar51 = ABS(local_48 -
                                 (((fVar8 - aVar50) * (local_48 - local_254)) / (local_33c - aVar50)
                                 + local_254));
                    if (180.0 <= fVar51) {
                      if ((local_33c != fVar8) || (NAN(local_33c) || NAN(fVar8))) {
                        dVar7 = floor((double)fVar51 / 90.0);
                        fVar48 = (local_33c - fVar8) / (float)(int)dVar7 + fVar8;
                        if (aVar49 <= fVar48) {
                          fVar48 = aVar49;
                        }
                      }
                    }
                  }
                  pCVar28 = pCVar28 + 1;
                } while (pCVar28 !=
                         local_358.
                         super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              pCVar28 = local_358.
                        super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              fVar8 = fVar48;
            } while (fVar48 <= 1e+19);
            std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::
            ~vector((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                     *)local_378);
          }
          uVar12 = local_318._8_8_;
          uVar11 = local_318._0_8_;
          if (local_318._0_8_ == local_318._8_8_) {
            pLVar20 = DefaultLogger::get();
            Logger::warn(pLVar20,
                         "Collada loader: found empty animation channel, ignored. Please check your exporter."
                        );
          }
          else {
            paVar24 = (aiNodeAnim *)operator_new(0x438);
            (paVar24->mNodeName).length = 0;
            (paVar24->mNodeName).data[0] = '\0';
            memset((paVar24->mNodeName).data + 1,0x1b,0x3ff);
            sVar14 = local_230._M_string_length;
            paVar24->mRotationKeys = (aiQuatKey *)0x0;
            paVar24->mNumScalingKeys = 0;
            *(undefined8 *)&paVar24->mNumPositionKeys = 0;
            *(undefined8 *)((long)&paVar24->mPositionKeys + 4) = 0;
            paVar24->mScalingKeys = (aiVectorKey *)0x0;
            paVar24->mPreState = aiAnimBehaviour_DEFAULT;
            paVar24->mPostState = aiAnimBehaviour_DEFAULT;
            local_378 = (undefined1  [8])paVar24;
            if (local_230._M_string_length < (pointer)0x400) {
              (paVar24->mNodeName).length = (ai_uint32)local_230._M_string_length;
              memcpy((paVar24->mNodeName).data,local_230._M_dataplus._M_p,local_230._M_string_length
                    );
              (paVar24->mNodeName).data[sVar14] = '\0';
            }
            uVar43 = (long)(uVar12 - uVar11) >> 6;
            uVar37 = (uint)uVar43;
            paVar24->mNumPositionKeys = uVar37;
            paVar24->mNumRotationKeys = uVar37;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar43;
            uVar45 = SUB168(auVar6 * ZEXT816(0x18),0);
            paVar24->mNumScalingKeys = uVar37;
            if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
              uVar45 = 0xffffffffffffffff;
            }
            paVar25 = (aiVectorKey *)operator_new__(uVar45);
            if (uVar12 != uVar11) {
              lVar19 = 0;
              do {
                puVar2 = (undefined8 *)((long)&paVar25->mTime + lVar19);
                *puVar2 = 0;
                puVar2[1] = 0;
                *(undefined4 *)((long)&(paVar25->mValue).z + lVar19) = 0;
                lVar19 = lVar19 + 0x18;
              } while (uVar43 * 0x18 != lVar19);
            }
            paVar24->mPositionKeys = paVar25;
            paVar26 = (aiQuatKey *)operator_new__(uVar45);
            if (uVar12 != uVar11) {
              paVar34 = paVar26;
              do {
                paVar34->mTime = 0.0;
                (paVar34->mValue).w = 1.0;
                (paVar34->mValue).x = 0.0;
                (paVar34->mValue).y = 0.0;
                (paVar34->mValue).z = 0.0;
                paVar34 = paVar34 + 1;
              } while (paVar34 != paVar26 + uVar43);
            }
            paVar24->mRotationKeys = paVar26;
            paVar25 = (aiVectorKey *)operator_new__(uVar45);
            if (uVar12 != uVar11) {
              lVar19 = 0;
              do {
                puVar2 = (undefined8 *)((long)&paVar25->mTime + lVar19);
                *puVar2 = 0;
                puVar2[1] = 0;
                *(undefined4 *)((long)&(paVar25->mValue).z + lVar19) = 0;
                lVar19 = lVar19 + 0x18;
              } while (uVar43 * 0x18 != lVar19);
            }
            paVar24->mScalingKeys = paVar25;
            if (local_318._8_8_ != local_318._0_8_) {
              lVar19 = 8;
              lVar47 = 0;
              uVar45 = 0;
              do {
                local_1c8 = *(undefined1 (*) [8])(local_318._0_8_ + lVar47);
                paStack_1c0 = *(aiAnimation **)((char *)(local_318._0_8_ + lVar47) + 8);
                local_1b8 = *(pointer *)
                             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(local_318._0_8_ + 0x10))->_M_local_buf + lVar47);
                p_Stack_1b0 = *(_Base_ptr *)
                               ((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)(local_318._0_8_ + 0x10))->_M_local_buf + lVar47) + 8);
                local_1a8 = *(_Base_ptr *)
                             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(local_318._0_8_ + 0x20))->_M_local_buf + lVar47);
                p_Stack_1a0 = *(_Base_ptr *)
                               (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)(local_318._0_8_ + 0x20))->_M_local_buf + lVar47 + 8);
                local_198 = *(pointer *)
                             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(local_318._0_8_ + 0x30))->_M_local_buf + lVar47);
                sVar46 = *(size_t *)
                          ((long)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)(local_318._0_8_ + 0x30))->_M_local_buf + lVar47) + 8);
                uStack_190._4_4_ = (float)(sVar46 >> 0x20);
                dVar7 = (double)uStack_190._4_4_;
                uStack_190._0_4_ = (float)sVar46;
                uStack_190 = (pointer)CONCAT44(0x3f800000,(float)uStack_190);
                *(double *)((long)*(aiVectorKey **)((long)local_378 + 0x408) + lVar19 + -8) = dVar7;
                *(double *)((long)*(aiQuatKey **)((long)local_378 + 0x418) + lVar19 + -8) = dVar7;
                *(double *)((long)*(aiVectorKey **)((long)local_378 + 0x428) + lVar19 + -8) = dVar7;
                aiMatrix4x4t<float>::Decompose
                          ((aiMatrix4x4t<float> *)local_1c8,
                           (aiVector3t<float> *)
                           ((long)&(*(aiVectorKey **)((long)local_378 + 0x428))->mTime + lVar19),
                           (aiQuaterniont<float> *)
                           ((long)&(*(aiQuatKey **)((long)local_378 + 0x418))->mTime + lVar19),
                           (aiVector3t<float> *)
                           ((long)&(*(aiVectorKey **)((long)local_378 + 0x408))->mTime + lVar19));
                uVar45 = uVar45 + 1;
                lVar19 = lVar19 + 0x18;
                lVar47 = lVar47 + 0x40;
              } while (uVar45 < (ulong)((long)(local_318._8_8_ - local_318._0_8_) >> 6));
            }
            if ((_Base_ptr)iStack_270._M_current == local_268) {
              std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
              _M_realloc_insert<aiNodeAnim*const&>
                        ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)&local_278,iStack_270,
                         (aiNodeAnim **)local_378);
              pParser = local_210;
            }
            else {
              *iStack_270._M_current = (aiNodeAnim *)local_378;
              iStack_270._M_current = iStack_270._M_current + 1;
              pParser = local_210;
            }
          }
          if ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)->mTimeAccessor->mCount != 0)) {
            local_1c8 = (undefined1  [8])0x0;
            paStack_1c0 = (aiAnimation *)0x0;
            local_1b8 = (pointer)0x0;
            if (local_358.
                super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_358.
                super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              psVar44 = &(local_358.
                          super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start)->mTargetId;
              do {
                if ((psVar44->_M_string_length != 0) &&
                   (lVar19 = std::__cxx11::string::find((char *)psVar44,0x6de58d,0), lVar19 != -1))
                {
                  std::
                  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ::push_back((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                               *)local_1c8,(value_type *)((long)(psVar44 + -1) + 0x18));
                }
                ppAVar9 = (Accessor **)(psVar44 + 3);
                psVar44 = (string *)((long)(psVar44 + 3) + 0x18);
              } while ((pointer)(ppAVar9 + 2) !=
                       local_358.
                       super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            auVar42 = local_1c8;
            if ((undefined1  [8])paStack_1c0 != local_1c8) {
              paVar27 = (aiMeshMorphAnim *)operator_new(0x410);
              (paVar27->mName).length = 0;
              (paVar27->mName).data[0] = '\0';
              memset((paVar27->mName).data + 1,0x1b,0x3ff);
              sVar14 = local_230._M_string_length;
              paVar27->mNumKeys = 0;
              paVar27->mKeys = (aiMeshMorphKey *)0x0;
              local_380 = paVar27;
              if (local_230._M_string_length < (pointer)0x400) {
                (paVar27->mName).length = (ai_uint32)local_230._M_string_length;
                memcpy((paVar27->mName).data,local_230._M_dataplus._M_p,local_230._M_string_length);
                (paVar27->mName).data[sVar14] = '\0';
              }
              local_378 = (undefined1  [8])0x0;
              pTStack_370 = (pointer)0x0;
              local_368[0] = (pointer)0x0;
              if (auVar42 != (undefined1  [8])paStack_1c0) {
                uVar37 = 0;
                do {
                  cVar39 = SUB81(auVar42,0) + '\b';
                  pCVar28 = (pointer)std::__cxx11::string::find(cVar39,0x28);
                  lVar19 = std::__cxx11::string::find(cVar39,0x29);
                  if ((pCVar28 != (pointer)0xffffffffffffffff) && (lVar19 != -1)) {
                    lVar19 = *(long *)((((aiAnimation *)auVar42)->mName).data + 0x5c);
                    lVar47 = *(long *)(lVar19 + 8);
                    if (*(long *)(lVar19 + 0x10) != lVar47) {
                      uVar45 = 0;
                      uVar43 = 1;
                      do {
                        lVar19 = *(long *)((((aiAnimation *)auVar42)->mName).data + 0x6c);
                        lVar4 = *(long *)(lVar19 + 8);
                        if ((ulong)(*(long *)(lVar19 + 0x10) - lVar4 >> 2) <= uVar45) {
                          std::__throw_out_of_range_fmt
                                    (
                                    "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                    );
                          goto LAB_0042aa22;
                        }
                        insertMorphTimeValue
                                  ((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                                    *)local_378,*(float *)(lVar47 + uVar45 * 4),
                                   *(float *)(lVar4 + uVar45 * 4),uVar37);
                        lVar19 = *(long *)((((aiAnimation *)auVar42)->mName).data + 0x5c);
                        lVar47 = *(long *)(lVar19 + 8);
                        bVar5 = uVar43 < (ulong)(*(long *)(lVar19 + 0x10) - lVar47 >> 2);
                        uVar45 = uVar43;
                        uVar43 = (ulong)((int)uVar43 + 1);
                      } while (bVar5);
                    }
                    uVar37 = uVar37 + 1;
                  }
                  auVar42 = (undefined1  [8])((((aiAnimation *)auVar42)->mName).data + 0x74);
                } while (auVar42 != (undefined1  [8])paStack_1c0);
              }
              paVar27 = local_380;
              uVar45 = (long)pTStack_370 - (long)local_378 >> 5;
              local_380->mNumKeys = (uint)uVar45;
              uVar45 = uVar45 & 0xffffffff;
              puVar29 = (ulong *)operator_new__(uVar45 * 0x20 + 8);
              *puVar29 = uVar45;
              if (uVar45 != 0) {
                lVar19 = 0;
                do {
                  puVar2 = (undefined8 *)((long)puVar29 + lVar19 + 0x14);
                  *puVar2 = 0;
                  puVar2[1] = 0;
                  puVar2 = (undefined8 *)((long)&((aiMeshMorphKey *)(puVar29 + 1))->mTime + lVar19);
                  *puVar2 = 0;
                  puVar2[1] = 0;
                  lVar19 = lVar19 + 0x20;
                } while (uVar45 * 0x20 != lVar19);
              }
              paVar27->mKeys = (aiMeshMorphKey *)(puVar29 + 1);
              if (local_380->mNumKeys != 0) {
                uVar37 = 0;
                do {
                  uVar43 = (ulong)uVar37;
                  local_380->mKeys[uVar43].mNumValuesAndWeights =
                       (int)((ulong)((long)paStack_1c0 - (long)local_1c8) >> 3) * -0x11111111;
                  lVar19 = (long)paStack_1c0 - (long)local_1c8 >> 3;
                  puVar30 = (uint *)operator_new__(-(ulong)((ulong)(lVar19 * -0x1111111111111111) >>
                                                            0x3e != 0) |
                                                   lVar19 * -0x4444444444444444);
                  local_380->mKeys[uVar43].mValues = puVar30;
                  lVar19 = (long)paStack_1c0 - (long)local_1c8 >> 3;
                  uVar45 = lVar19 * 0x7777777777777778;
                  if (0x1fffffffffffffff < (ulong)(lVar19 * -0x1111111111111111)) {
                    uVar45 = 0xffffffffffffffff;
                  }
                  pdVar31 = (double *)operator_new__(uVar45);
                  local_380->mKeys[uVar43].mWeights = pdVar31;
                  local_380->mKeys[uVar43].mTime =
                       (double)*(float *)(((aiString *)local_378)->data + uVar43 * 0x20 + -4);
                  if ((undefined1  [8])paStack_1c0 != local_1c8) {
                    uVar45 = 0;
                    do {
                      uVar33 = (uint)uVar45;
                      local_380->mKeys[uVar43].mValues[uVar45] = uVar33;
                      lVar19 = *(long *)(((aiString *)local_378)->data +
                                        (long)(int)uVar37 * 0x20 + 4);
                      lVar47 = *(long *)(((aiString *)local_378)->data +
                                        (long)(int)uVar37 * 0x20 + 0xc) - lVar19;
                      dVar7 = 0.0;
                      if (lVar47 != 0) {
                        uVar40 = 1;
                        uVar35 = 0;
                        do {
                          if (*(uint *)(lVar19 + 4 + uVar35 * 8) == uVar33) {
                            dVar7 = (double)*(float *)(lVar19 + uVar35 * 8);
                            break;
                          }
                          uVar35 = (ulong)uVar40;
                          uVar40 = uVar40 + 1;
                          dVar7 = 0.0;
                        } while (uVar35 < (ulong)(lVar47 >> 3));
                      }
                      local_380->mKeys[uVar43].mWeights[uVar45] = dVar7;
                      uVar45 = (ulong)(uVar33 + 1);
                      uVar35 = ((long)paStack_1c0 - (long)local_1c8 >> 3) * -0x1111111111111111;
                    } while (uVar45 <= uVar35 && uVar35 - uVar45 != 0);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 < local_380->mNumKeys);
              }
              if (iStack_330._M_current == (aiMeshMorphAnim **)local_328._M_p) {
                std::vector<aiMeshMorphAnim*,std::allocator<aiMeshMorphAnim*>>::
                _M_realloc_insert<aiMeshMorphAnim*const&>
                          ((vector<aiMeshMorphAnim*,std::allocator<aiMeshMorphAnim*>> *)&local_338,
                           iStack_330,&local_380);
              }
              else {
                *iStack_330._M_current = local_380;
                iStack_330._M_current = iStack_330._M_current + 1;
              }
              std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
              ~vector((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *)
                      local_378);
            }
            std::
            vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
            ~vector((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     *)local_1c8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_318._0_8_,(long)local_308 - local_318._0_8_);
          }
        }
        if (local_298 != (_Base_ptr)(local_290 + 8)) {
          operator_delete(local_298,CONCAT71(local_290._9_7_,local_290[8]) + 1);
        }
        this = local_1d8;
        if ((char *)local_250._M_allocated_capacity != &local_240) {
          operator_delete((void *)local_250._M_allocated_capacity,
                          CONCAT71(acStack_23f._0_7_,local_240) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
      ~vector(&local_358);
      ppVar16 = (pointer)&local_1d0->second;
    } while (ppVar16 !=
             (pointer)local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  iVar13._M_current = iStack_270._M_current;
  p_Var36 = local_278;
  if ((local_278 != (_Base_ptr)iStack_270._M_current) || (local_338 != iStack_330._M_current)) {
    paVar32 = (aiAnimation *)operator_new(0x448);
    (paVar32->mName).length = 0;
    (paVar32->mName).data[0] = '\0';
    memset((paVar32->mName).data + 1,0x1b,0x3ff);
    paVar32->mDuration = -1.0;
    paVar32->mTicksPerSecond = 0.0;
    paVar32->mNumChannels = 0;
    paVar32->mChannels = (aiNodeAnim **)0x0;
    paVar32->mNumMeshChannels = 0;
    paVar32->mMeshChannels = (aiMeshAnim **)0x0;
    paVar32->mNumMorphMeshChannels = 0;
    paVar32->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
    uVar45 = local_1e0->_M_string_length;
    local_1c8 = (undefined1  [8])paVar32;
    if (uVar45 < 0x400) {
      (paVar32->mName).length = (ai_uint32)uVar45;
      memcpy((paVar32->mName).data,(local_1e0->_M_dataplus)._M_p,uVar45);
      (paVar32->mName).data[uVar45] = '\0';
    }
    sVar17 = (long)iVar13._M_current - (long)p_Var36;
    uVar37 = (uint)((long)sVar17 >> 3);
    paVar32->mNumChannels = uVar37;
    if (uVar37 != 0) {
      uVar45 = 0xffffffffffffffff;
      if ((ulong)((long)sVar17 >> 3) < 0x2000000000000000) {
        uVar45 = sVar17;
      }
      __dest = (aiNodeAnim **)operator_new__(uVar45);
      paVar32->mChannels = __dest;
      if (p_Var36 != (_Base_ptr)iVar13._M_current) {
        memmove(__dest,p_Var36,sVar17);
      }
    }
    auVar42 = local_1c8;
    iVar10._M_current = iStack_330._M_current;
    __src = local_338;
    uVar45 = (long)iStack_330._M_current - (long)local_338;
    uVar37 = (uint)(uVar45 >> 3);
    *(uint *)((long)local_1c8 + 0x438) = uVar37;
    if (uVar37 != 0) {
      __dest_00 = (aiMeshMorphAnim **)operator_new__(uVar45 & 0x7fffffff8);
      *(aiMeshMorphAnim ***)((long)auVar42 + 0x440) = __dest_00;
      if (iVar10._M_current != __src) {
        memmove(__dest_00,__src,uVar45);
      }
    }
    *(double *)((long)local_1c8 + 0x408) = 0.0;
    if ((long)iStack_270._M_current - (long)local_278 != 0) {
      lVar19 = (long)iStack_270._M_current - (long)local_278 >> 3;
      uVar52 = SUB84(*(double *)((long)local_1c8 + 0x408),0);
      uVar53 = (undefined4)((ulong)*(double *)((long)local_1c8 + 0x408) >> 0x20);
      lVar47 = 0;
      do {
        dVar7 = *(double *)
                 (*(long *)(*(long *)(&local_278->_M_color + lVar47 * 2) + 0x408) +
                 (ulong)(*(int *)(*(long *)(&local_278->_M_color + lVar47 * 2) + 0x404) - 1) * 0x18)
        ;
        uVar54 = SUB84(dVar7,0);
        uVar55 = (int)((ulong)dVar7 >> 0x20);
        if (dVar7 <= (double)CONCAT44(uVar53,uVar52)) {
          uVar54 = uVar52;
          uVar55 = uVar53;
        }
        *(ulong *)((long)local_1c8 + 0x408) = CONCAT44(uVar55,uVar54);
        dVar7 = *(double *)
                 (*(long *)(*(long *)(&local_278->_M_color + lVar47 * 2) + 0x418) +
                 (ulong)(*(int *)(*(long *)(&local_278->_M_color + lVar47 * 2) + 0x410) - 1) * 0x18)
        ;
        uVar56 = SUB84(dVar7,0);
        uVar57 = (int)((ulong)dVar7 >> 0x20);
        if (dVar7 <= (double)CONCAT44(uVar55,uVar54)) {
          uVar56 = uVar54;
          uVar57 = uVar55;
        }
        *(ulong *)((long)local_1c8 + 0x408) = CONCAT44(uVar57,uVar56);
        dVar7 = *(double *)
                 (*(long *)(*(long *)(&local_278->_M_color + lVar47 * 2) + 0x428) +
                 (ulong)(*(int *)(*(long *)(&local_278->_M_color + lVar47 * 2) + 0x420) - 1) * 0x18)
        ;
        uVar52 = SUB84(dVar7,0);
        uVar53 = (int)((ulong)dVar7 >> 0x20);
        if (dVar7 <= (double)CONCAT44(uVar57,uVar56)) {
          uVar52 = uVar56;
          uVar53 = uVar57;
        }
        *(ulong *)((long)local_1c8 + 0x408) = CONCAT44(uVar53,uVar52);
        lVar47 = lVar47 + 1;
      } while (lVar19 + (ulong)(lVar19 == 0) != lVar47);
    }
    if ((long)iStack_330._M_current - (long)local_338 != 0) {
      lVar19 = (long)iStack_330._M_current - (long)local_338 >> 3;
      uVar52 = SUB84(*(double *)((long)local_1c8 + 0x408),0);
      uVar53 = (undefined4)((ulong)*(double *)((long)local_1c8 + 0x408) >> 0x20);
      lVar47 = 0;
      do {
        dVar7 = local_338[lVar47]->mKeys[local_338[lVar47]->mNumKeys - 1].mTime;
        uVar54 = SUB84(dVar7,0);
        uVar55 = (int)((ulong)dVar7 >> 0x20);
        if (dVar7 <= (double)CONCAT44(uVar53,uVar52)) {
          uVar54 = uVar52;
          uVar55 = uVar53;
        }
        uVar53 = uVar55;
        uVar52 = uVar54;
        *(ulong *)((long)local_1c8 + 0x408) = CONCAT44(uVar53,uVar52);
        lVar47 = lVar47 + 1;
      } while (lVar19 + (ulong)(lVar19 == 0) != lVar47);
    }
    *(double *)((long)local_1c8 + 0x410) = 1.0;
    __position._M_current =
         (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiAnimation*,std::allocator<aiAnimation*>>::_M_realloc_insert<aiAnimation*const&>
                ((vector<aiAnimation*,std::allocator<aiAnimation*>> *)&this->mAnims,__position,
                 (aiAnimation **)local_1c8);
    }
    else {
      *__position._M_current = (aiAnimation *)local_1c8;
      pppaVar1 = &(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
  }
  if (local_338 != (aiMeshMorphAnim **)0x0) {
    operator_delete(local_338,(long)local_328._M_p - (long)local_338);
  }
  if (local_278 != (_Base_ptr)0x0) {
    operator_delete(local_278,(long)local_268 - (long)local_278);
  }
  if ((pointer)local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl
               .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ColladaLoader::CreateAnimation(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string& pName)
{
    // collect a list of animatable nodes
    std::vector<const aiNode*> nodes;
    CollectNodes(pScene->mRootNode, nodes);

    std::vector<aiNodeAnim*> anims;
    std::vector<aiMeshMorphAnim*> morphAnims;

    for (std::vector<const aiNode*>::const_iterator nit = nodes.begin(); nit != nodes.end(); ++nit)
    {
        // find all the collada anim channels which refer to the current node
        std::vector<Collada::ChannelEntry> entries;
        std::string nodeName = (*nit)->mName.data;

        // find the collada node corresponding to the aiNode
        const Collada::Node* srcNode = FindNode(pParser.mRootNode, nodeName);
        //      ai_assert( srcNode != NULL);
        if (!srcNode)
            continue;

        // now check all channels if they affect the current node
        std::string targetID, subElement;
        for (std::vector<Collada::AnimationChannel>::const_iterator cit = pSrcAnim->mChannels.begin();
            cit != pSrcAnim->mChannels.end(); ++cit)
        {
            const Collada::AnimationChannel& srcChannel = *cit;
            Collada::ChannelEntry entry;

            // we expect the animation target to be of type "nodeName/transformID.subElement". Ignore all others
            // find the slash that separates the node name - there should be only one
            std::string::size_type slashPos = srcChannel.mTarget.find('/');
            if (slashPos == std::string::npos)
            {
                std::string::size_type targetPos = srcChannel.mTarget.find(srcNode->mID);
                if (targetPos == std::string::npos)
                    continue;

                // not node transform, but something else. store as unknown animation channel for now
                entry.mChannel = &(*cit);
                entry.mTargetId = srcChannel.mTarget.substr(targetPos + pSrcAnim->mName.length(),
                    srcChannel.mTarget.length() - targetPos - pSrcAnim->mName.length());
                if (entry.mTargetId.front() == '-')
                    entry.mTargetId = entry.mTargetId.substr(1);
                entries.push_back(entry);
                continue;
            }
            if (srcChannel.mTarget.find('/', slashPos + 1) != std::string::npos)
                continue;

            targetID.clear();
            targetID = srcChannel.mTarget.substr(0, slashPos);
            if (targetID != srcNode->mID)
                continue;

            // find the dot that separates the transformID - there should be only one or zero
            std::string::size_type dotPos = srcChannel.mTarget.find('.');
            if (dotPos != std::string::npos)
            {
                if (srcChannel.mTarget.find('.', dotPos + 1) != std::string::npos)
                    continue;

                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, dotPos - slashPos - 1);

                subElement.clear();
                subElement = srcChannel.mTarget.substr(dotPos + 1);
                if (subElement == "ANGLE")
                    entry.mSubElement = 3; // last number in an Axis-Angle-Transform is the angle
                else if (subElement == "X")
                    entry.mSubElement = 0;
                else if (subElement == "Y")
                    entry.mSubElement = 1;
                else if (subElement == "Z")
                    entry.mSubElement = 2;
                else
                    ASSIMP_LOG_WARN_F("Unknown anim subelement <", subElement, ">. Ignoring");
            }
            else {
                // no subelement following, transformId is remaining string
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1);
            }

            std::string::size_type bracketPos = srcChannel.mTarget.find('(');
            if (bracketPos != std::string::npos)
            {
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, bracketPos - slashPos - 1);
                subElement.clear();
                subElement = srcChannel.mTarget.substr(bracketPos);

                if (subElement == "(0)(0)")
                    entry.mSubElement = 0;
                else if (subElement == "(1)(0)")
                    entry.mSubElement = 1;
                else if (subElement == "(2)(0)")
                    entry.mSubElement = 2;
                else if (subElement == "(3)(0)")
                    entry.mSubElement = 3;
                else if (subElement == "(0)(1)")
                    entry.mSubElement = 4;
                else if (subElement == "(1)(1)")
                    entry.mSubElement = 5;
                else if (subElement == "(2)(1)")
                    entry.mSubElement = 6;
                else if (subElement == "(3)(1)")
                    entry.mSubElement = 7;
                else if (subElement == "(0)(2)")
                    entry.mSubElement = 8;
                else if (subElement == "(1)(2)")
                    entry.mSubElement = 9;
                else if (subElement == "(2)(2)")
                    entry.mSubElement = 10;
                else if (subElement == "(3)(2)")
                    entry.mSubElement = 11;
                else if (subElement == "(0)(3)")
                    entry.mSubElement = 12;
                else if (subElement == "(1)(3)")
                    entry.mSubElement = 13;
                else if (subElement == "(2)(3)")
                    entry.mSubElement = 14;
                else if (subElement == "(3)(3)")
                    entry.mSubElement = 15;
            }

            // determine which transform step is affected by this channel
            entry.mTransformIndex = SIZE_MAX;
            for (size_t a = 0; a < srcNode->mTransforms.size(); ++a)
                if (srcNode->mTransforms[a].mID == entry.mTransformId)
                    entry.mTransformIndex = a;

            if (entry.mTransformIndex == SIZE_MAX)
            {
                if (entry.mTransformId.find("morph-weights") != std::string::npos)
                {
                    entry.mTargetId = entry.mTransformId;
                    entry.mTransformId = "";
                }
                else
                    continue;
            }

            entry.mChannel = &(*cit);
            entries.push_back(entry);
        }

        // if there's no channel affecting the current node, we skip it
        if (entries.empty())
            continue;

        // resolve the data pointers for all anim channels. Find the minimum time while we're at it
        ai_real startTime = ai_real(1e20), endTime = ai_real(-1e20);
        for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
        {
            Collada::ChannelEntry& e = *it;
            e.mTimeAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceTimes);
            e.mTimeData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mTimeAccessor->mSource);
            e.mValueAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceValues);
            e.mValueData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mValueAccessor->mSource);

            // time count and value count must match
            if (e.mTimeAccessor->mCount != e.mValueAccessor->mCount)
                throw DeadlyImportError(format() << "Time count / value count mismatch in animation channel \"" << e.mChannel->mTarget << "\".");

            if (e.mTimeAccessor->mCount > 0)
            {
                // find bounding times
                startTime = std::min(startTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, 0, 0));
                endTime = std::max(endTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, e.mTimeAccessor->mCount - 1, 0));
            }
        }

        std::vector<aiMatrix4x4> resultTrafos;
        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            // create a local transformation chain of the node's transforms
            std::vector<Collada::Transform> transforms = srcNode->mTransforms;

            // now for every unique point in time, find or interpolate the key values for that time
            // and apply them to the transform chain. Then the node's present transformation can be calculated.
            ai_real time = startTime;
            while (1)
            {
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;

                    // find the keyframe behind the current point in time
                    size_t pos = 0;
                    ai_real postTime = 0.0;
                    while (1)
                    {
                        if (pos >= e.mTimeAccessor->mCount)
                            break;
                        postTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos, 0);
                        if (postTime >= time)
                            break;
                        ++pos;
                    }

                    pos = std::min(pos, e.mTimeAccessor->mCount - 1);

                    // read values from there
                    ai_real temp[16];
                    for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        temp[c] = ReadFloat(*e.mValueAccessor, *e.mValueData, pos, c);

                    // if not exactly at the key time, interpolate with previous value set
                    if (postTime > time && pos > 0)
                    {
                        ai_real preTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos - 1, 0);
                        ai_real factor = (time - postTime) / (preTime - postTime);

                        for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        {
                            ai_real v = ReadFloat(*e.mValueAccessor, *e.mValueData, pos - 1, c);
                            temp[c] += (v - temp[c]) * factor;
                        }
                    }

                    // Apply values to current transformation
                    std::copy(temp, temp + e.mValueAccessor->mSize, transforms[e.mTransformIndex].f + e.mSubElement);
                }

                // Calculate resulting transformation
                aiMatrix4x4 mat = pParser.CalculateResultTransform(transforms);

                // out of laziness: we store the time in matrix.d4
                mat.d4 = time;
                resultTrafos.push_back(mat);

                // find next point in time to evaluate. That's the closest frame larger than the current in any channel
                ai_real nextTime = ai_real(1e20);
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& channelElement = *it;

                    // find the next time value larger than the current
                    size_t pos = 0;
                    while (pos < channelElement.mTimeAccessor->mCount)
                    {
                        const ai_real t = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        if (t > time)
                        {
                            nextTime = std::min(nextTime, t);
                            break;
                        }
                        ++pos;
                    }

                    // https://github.com/assimp/assimp/issues/458
                    // Sub-sample axis-angle channels if the delta between two consecutive
                    // key-frame angles is >= 180 degrees.
                    if (transforms[channelElement.mTransformIndex].mType == Collada::TF_ROTATE && channelElement.mSubElement == 3 && pos > 0 && pos < channelElement.mTimeAccessor->mCount) {
                        const ai_real cur_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos, 0);
                        const ai_real last_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos - 1, 0);
                        const ai_real cur_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        const ai_real last_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos - 1, 0);
                        const ai_real last_eval_angle = last_key_angle + (cur_key_angle - last_key_angle) * (time - last_key_time) / (cur_key_time - last_key_time);
                        const ai_real delta = std::abs(cur_key_angle - last_eval_angle);
                        if (delta >= 180.0) {
                            const int subSampleCount = static_cast<int>(std::floor(delta / 90.0));
                            if (cur_key_time != time) {
                                const ai_real nextSampleTime = time + (cur_key_time - time) / subSampleCount;
                                nextTime = std::min(nextTime, nextSampleTime);
                            }
                        }
                    }
                }

                // no more keys on any channel after the current time -> we're done
                if (nextTime > 1e19)
                    break;

                // else construct next keyframe at this following time point
                time = nextTime;
            }
        }

        // there should be some keyframes, but we aren't that fixated on valid input data
//      ai_assert( resultTrafos.size() > 0);

        // build an animation channel for the given node out of these trafo keys
        if (!resultTrafos.empty())
        {
            aiNodeAnim* dstAnim = new aiNodeAnim;
            dstAnim->mNodeName = nodeName;
            dstAnim->mNumPositionKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumRotationKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumScalingKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mPositionKeys = new aiVectorKey[resultTrafos.size()];
            dstAnim->mRotationKeys = new aiQuatKey[resultTrafos.size()];
            dstAnim->mScalingKeys = new aiVectorKey[resultTrafos.size()];

            for (size_t a = 0; a < resultTrafos.size(); ++a)
            {
                aiMatrix4x4 mat = resultTrafos[a];
                double time = double(mat.d4); // remember? time is stored in mat.d4
                mat.d4 = 1.0f;

                dstAnim->mPositionKeys[a].mTime = time;
                dstAnim->mRotationKeys[a].mTime = time;
                dstAnim->mScalingKeys[a].mTime = time;
                mat.Decompose(dstAnim->mScalingKeys[a].mValue, dstAnim->mRotationKeys[a].mValue, dstAnim->mPositionKeys[a].mValue);
            }

            anims.push_back(dstAnim);
        }
        else
        {
            ASSIMP_LOG_WARN("Collada loader: found empty animation channel, ignored. Please check your exporter.");
        }

        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            std::vector<Collada::ChannelEntry> morphChannels;
            for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
            {
                Collada::ChannelEntry& e = *it;

                // skip non-transform types
                if (e.mTargetId.empty())
                    continue;

                if (e.mTargetId.find("morph-weights") != std::string::npos)
                    morphChannels.push_back(e);
            }
            if (morphChannels.size() > 0)
            {
                // either 1) morph weight animation count should contain morph target count channels
                // or     2) one channel with morph target count arrays
                // assume first

                aiMeshMorphAnim *morphAnim = new aiMeshMorphAnim;
                morphAnim->mName.Set(nodeName);

                std::vector<MorphTimeValues> morphTimeValues;

                int morphAnimChannelIndex = 0;
                for (std::vector<Collada::ChannelEntry>::iterator it = morphChannels.begin(); it != morphChannels.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;
                    std::string::size_type apos = e.mTargetId.find('(');
                    std::string::size_type bpos = e.mTargetId.find(')');
                    if (apos == std::string::npos || bpos == std::string::npos)
                        // unknown way to specify weight -> ignore this animation
                        continue;

                    // weight target can be in format Weight_M_N, Weight_N, WeightN, or some other way
                    // we ignore the name and just assume the channels are in the right order
                    for (unsigned int i = 0; i < e.mTimeData->mValues.size(); i++)
                        insertMorphTimeValue(morphTimeValues, e.mTimeData->mValues.at(i), e.mValueData->mValues.at(i), morphAnimChannelIndex);

                    ++morphAnimChannelIndex;
                }

                morphAnim->mNumKeys = static_cast<unsigned int>(morphTimeValues.size());
                morphAnim->mKeys = new aiMeshMorphKey[morphAnim->mNumKeys];
                for (unsigned int key = 0; key < morphAnim->mNumKeys; key++)
                {
                    morphAnim->mKeys[key].mNumValuesAndWeights = static_cast<unsigned int>(morphChannels.size());
                    morphAnim->mKeys[key].mValues = new unsigned int[morphChannels.size()];
                    morphAnim->mKeys[key].mWeights = new double[morphChannels.size()];

                    morphAnim->mKeys[key].mTime = morphTimeValues[key].mTime;
                    for (unsigned int valueIndex = 0; valueIndex < morphChannels.size(); valueIndex++)
                    {
                        morphAnim->mKeys[key].mValues[valueIndex] = valueIndex;
                        morphAnim->mKeys[key].mWeights[valueIndex] = getWeightAtKey(morphTimeValues, key, valueIndex);
                    }
                }

                morphAnims.push_back(morphAnim);
            }
        }
    }

    if (!anims.empty() || !morphAnims.empty())
    {
        aiAnimation* anim = new aiAnimation;
        anim->mName.Set(pName);
        anim->mNumChannels = static_cast<unsigned int>(anims.size());
        if (anim->mNumChannels > 0)
        {
            anim->mChannels = new aiNodeAnim*[anims.size()];
            std::copy(anims.begin(), anims.end(), anim->mChannels);
        }
        anim->mNumMorphMeshChannels = static_cast<unsigned int>(morphAnims.size());
        if (anim->mNumMorphMeshChannels > 0)
        {
            anim->mMorphMeshChannels = new aiMeshMorphAnim*[anim->mNumMorphMeshChannels];
            std::copy(morphAnims.begin(), morphAnims.end(), anim->mMorphMeshChannels);
        }
        anim->mDuration = 0.0f;
        for (size_t a = 0; a < anims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, anims[a]->mPositionKeys[anims[a]->mNumPositionKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mRotationKeys[anims[a]->mNumRotationKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mScalingKeys[anims[a]->mNumScalingKeys - 1].mTime);
        }
        for (size_t a = 0; a < morphAnims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, morphAnims[a]->mKeys[morphAnims[a]->mNumKeys - 1].mTime);
        }
        anim->mTicksPerSecond = 1;
        mAnims.push_back(anim);
    }
}